

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void __thiscall
DLightTransfer::DLightTransfer(DLightTransfer *this,sector_t *srcSec,int target,bool copyFloor)

{
  int *piVar1;
  short sVar2;
  uint uVar3;
  FSectorTagIterator itr;
  FSectorTagIterator local_28;
  
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00701478;
  this->Source = srcSec;
  this->TargetTag = target;
  this->CopyFloor = copyFloor;
  sVar2 = srcSec->lightlevel;
  this->LastLight = sVar2;
  DoTransfer((int)sVar2,target,copyFloor);
  if (copyFloor) {
    if (target == 0) {
      local_28.start = 0;
    }
    else {
      local_28.start = tagManager.TagHashFirst[target & 0xff];
    }
    local_28.searchtag = target;
    while( true ) {
      uVar3 = FSectorTagIterator::Next(&local_28);
      if ((int)uVar3 < 0) break;
      piVar1 = &sectors[uVar3].planes[0].Flags;
      *piVar1 = *piVar1 | 1;
    }
  }
  else {
    if (target == 0) {
      local_28.start = 0;
    }
    else {
      local_28.start = tagManager.TagHashFirst[target & 0xff];
    }
    local_28.searchtag = target;
    while( true ) {
      uVar3 = FSectorTagIterator::Next(&local_28);
      if ((int)uVar3 < 0) break;
      piVar1 = &sectors[uVar3].planes[1].Flags;
      *piVar1 = *piVar1 | 1;
    }
  }
  DThinker::ChangeStatNum(&this->super_DThinker,0x27);
  return;
}

Assistant:

DLightTransfer::DLightTransfer (sector_t *srcSec, int target, bool copyFloor)
{
	int secnum;

	Source = srcSec;
	TargetTag = target;
	CopyFloor = copyFloor;
	DoTransfer (LastLight = srcSec->lightlevel, target, copyFloor);

	if (copyFloor)
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);
	}
	else
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);
	}
	ChangeStatNum (STAT_LIGHTTRANSFER);
}